

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadArenaString
          (EpsCopyInputStream *this,char *ptr,ArenaStringPtr *s,Arena *arena)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  char *pcVar2;
  string *psVar3;
  char *extraout_RAX;
  EpsCopyInputStream *unaff_RBX;
  uint unaff_EBP;
  EpsCopyInputStream *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R12;
  ArenaStringPtr *unaff_R14;
  char *unaff_R15;
  pair<const_char_*,_int> pVar4;
  anon_class_8_1_a7a63227 local_40;
  anon_class_8_1_a7a63227 local_30;
  
  if (arena == (Arena *)0x0) {
    ReadArenaString((EpsCopyInputStream *)&stack0xffffffffffffffc0);
LAB_0013563c:
    s_00 = unaff_R12;
    this_00 = (EpsCopyInputStream *)&stack0xffffffffffffffc0;
    ReadArenaString(this_00);
  }
  else {
    bVar1 = *ptr;
    unaff_EBP = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      pVar4 = ReadSizeFallback(ptr,(uint)bVar1);
      unaff_R15 = pVar4.first;
      unaff_EBP = pVar4.second;
    }
    else {
      unaff_R15 = ptr + 1;
    }
    if (unaff_R15 == (char *)0x0) {
      return (char *)0x0;
    }
    local_40.arena = arena;
    local_30.arena = arena;
    s_00 = absl::lts_20240722::utility_internal::
           IfConstexprElse<false,google::protobuf::Arena::Create<std::__cxx11::string>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_1_,google::protobuf::Arena::Create<std::__cxx11::string>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_2_>
                     (&stack0xffffffffffffffc0,&stack0xffffffffffffffd0);
    unaff_RBX = this;
    unaff_R12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arena;
    unaff_R14 = s;
    if (s_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0013563c;
    this_00 = (EpsCopyInputStream *)((ulong)s_00 & 3);
    if (this_00 == (EpsCopyInputStream *)0x0) {
      psVar3 = (string *)0x0;
      goto LAB_00135602;
    }
  }
  psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                     ((ulong)this_00,0,"reinterpret_cast<uintptr_t>(p) & kMask == 0UL");
LAB_00135602:
  if (psVar3 == (string *)0x0) {
    (unaff_R14->tagged_ptr_).ptr_ = (void *)((ulong)s_00 | 3);
    pcVar2 = ReadString(unaff_RBX,unaff_R15,unaff_EBP,s_00);
    return pcVar2;
  }
  ReadArenaString();
  absl::lts_20240722::Mutex::Dtor();
  return extraout_RAX;
}

Assistant:

const char* EpsCopyInputStream::ReadArenaString(const char* ptr,
                                                ArenaStringPtr* s,
                                                Arena* arena) {
  ScopedCheckPtrInvariants check(&s->tagged_ptr_);
  ABSL_DCHECK(arena != nullptr);

  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;

  auto* str = s->NewString(arena);
  ptr = ReadString(ptr, size, str);
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  return ptr;
}